

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswTable.c
# Opt level: O1

Aig_Obj_t * Csw_TableCutLookup(Csw_Man_t *p,Csw_Cut_t *pCut)

{
  char cVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  Csw_Cut_t *pCVar11;
  Aig_Obj_t *pAVar12;
  ulong uVar13;
  
  uVar6 = Csw_CutHash(pCut);
  pCVar11 = p->pTable[(int)(uVar6 % (uint)p->nTableSize)];
  if (pCVar11 != (Csw_Cut_t *)0x0) {
    cVar1 = pCut->nFanins;
    uVar13 = 1;
    if (5 < (long)cVar1) {
      uVar13 = (ulong)(uint)(1 << (cVar1 - 5U & 0x1f));
    }
    do {
      if (((pCVar11->nFanins == cVar1) && (pCVar11->uSign == pCut->uSign)) &&
         (iVar7 = bcmp(pCVar11 + 1,pCut + 1,(long)cVar1 * 4), iVar7 == 0)) {
        lVar8 = (long)pCVar11->nLeafMax;
        lVar9 = (long)pCut->nLeafMax;
        uVar10 = uVar13;
        if (((*(uint *)((long)&pCut[1].pNext + lVar9 * 4) ^
             *(uint *)((long)&pCVar11[1].pNext + lVar8 * 4)) & 1) == 0) {
          do {
            iVar7 = (int)uVar10;
            if (iVar7 < 1) goto LAB_004a3dcd;
            lVar4 = uVar10 * 2;
            lVar5 = uVar10 * 2;
            uVar10 = uVar10 - 1;
          } while (*(int *)(&pCVar11->nCutSize + lVar8 * 2 + lVar4) ==
                   *(int *)(&pCut->nCutSize + lVar9 * 2 + lVar5));
          if (iVar7 < 1) {
LAB_004a3dcd:
            iVar7 = pCVar11->iNode;
            if ((-1 < (long)iVar7) && (pVVar3 = p->pManRes->vObjs, iVar7 < pVVar3->nSize)) {
              iVar2 = pCut->iNode;
              if ((-1 < (long)iVar2) && (iVar2 < pVVar3->nSize)) {
                if ((((uint)*(undefined8 *)&((Aig_Obj_t *)pVVar3->pArray[iVar7])->field_0x18 ^
                     *(uint *)((long)pVVar3->pArray[iVar2] + 0x18)) & 8) != 0) {
                  __assert_fail("pRes->fPhase == Aig_ManObj( p->pManRes, pCut->iNode )->fPhase",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswTable.c"
                                ,0x8e,"Aig_Obj_t *Csw_TableCutLookup(Csw_Man_t *, Csw_Cut_t *)");
                }
                return (Aig_Obj_t *)pVVar3->pArray[iVar7];
              }
            }
LAB_004a3e78:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
        }
        else {
          do {
            iVar7 = (int)uVar10;
            if (iVar7 < 1) goto LAB_004a3d8e;
            lVar4 = uVar10 * 2;
            lVar5 = uVar10 * 2;
            uVar10 = uVar10 - 1;
          } while ((*(uint *)(&pCut->nCutSize + lVar9 * 2 + lVar4) ^
                   *(uint *)(&pCVar11->nCutSize + lVar8 * 2 + lVar5)) == 0xffffffff);
          if (iVar7 < 1) {
LAB_004a3d8e:
            pVVar3 = p->pManRes->vObjs;
            if (pVVar3 == (Vec_Ptr_t *)0x0) {
              pAVar12 = (Aig_Obj_t *)0x1;
            }
            else {
              uVar6 = pCVar11->iNode;
              if (((int)uVar6 < 0) || (pVVar3->nSize <= (int)uVar6)) goto LAB_004a3e78;
              pAVar12 = (Aig_Obj_t *)((ulong)pVVar3->pArray[uVar6] ^ 1);
            }
            iVar7 = pCut->iNode;
            if ((-1 < (long)iVar7) && (iVar7 < pVVar3->nSize)) {
              if ((((uint)*(undefined8 *)(((ulong)pAVar12 & 0xfffffffffffffffe) + 0x18) ^
                   *(uint *)((long)pVVar3->pArray[iVar7] + 0x18)) & 8) == 0) {
                __assert_fail("Aig_Regular(pRes)->fPhase != Aig_ManObj( p->pManRes, pCut->iNode )->fPhase"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswTable.c"
                              ,0x97,"Aig_Obj_t *Csw_TableCutLookup(Csw_Man_t *, Csw_Cut_t *)");
              }
              return pAVar12;
            }
            goto LAB_004a3e78;
          }
        }
      }
      pCVar11 = pCVar11->pNext;
    } while (pCVar11 != (Csw_Cut_t *)0x0);
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

Aig_Obj_t * Csw_TableCutLookup( Csw_Man_t * p, Csw_Cut_t * pCut )
{
    Aig_Obj_t * pRes = NULL;
    Csw_Cut_t * pEnt;
    unsigned * pTruthNew, * pTruthOld;
    int iEntry = Csw_CutHash(pCut) % p->nTableSize;
    for ( pEnt = p->pTable[iEntry]; pEnt; pEnt = pEnt->pNext )
    {
        if ( pEnt->nFanins != pCut->nFanins )
            continue;
        if ( pEnt->uSign != pCut->uSign )
            continue;
        if ( memcmp( pEnt->pFanins, pCut->pFanins, sizeof(int) * pCut->nFanins ) )
            continue;
        pTruthOld = Csw_CutTruth(pEnt);
        pTruthNew = Csw_CutTruth(pCut);
        if ( (pTruthOld[0] & 1) == (pTruthNew[0] & 1) )
        {
            if ( Kit_TruthIsEqual( pTruthOld, pTruthNew, pCut->nFanins ) )
            {
                pRes = Aig_ManObj( p->pManRes, pEnt->iNode );
                assert( pRes->fPhase == Aig_ManObj( p->pManRes, pCut->iNode )->fPhase );
                break;
            }
        }
        else
        {
            if ( Kit_TruthIsOpposite( pTruthOld, pTruthNew, pCut->nFanins ) )
            {
                pRes = Aig_Not( Aig_ManObj( p->pManRes, pEnt->iNode ) );
                assert( Aig_Regular(pRes)->fPhase != Aig_ManObj( p->pManRes, pCut->iNode )->fPhase );
                break;
            }
        }
    }
    return pRes;
}